

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O0

SExpr * SExprAlloc(SExprParser *parser,SExprType type)

{
  SExpr *pSVar1;
  size_t sVar2;
  SExpr *expr;
  SExprType type_local;
  SExprParser *parser_local;
  
  if (parser->pool == (SExprPool *)0x0) {
    parser->poolUsed = parser->poolUsed + 1;
    parser_local = (SExprParser *)&SExprAlloc::dummy;
  }
  else if (parser->poolUsed < parser->pool->count) {
    pSVar1 = parser->pool->data;
    sVar2 = parser->poolUsed;
    parser->poolUsed = sVar2 + 1;
    parser_local = (SExprParser *)(pSVar1 + sVar2);
    *(SExprType *)&parser_local->src = type;
    parser_local->len = 0;
  }
  else {
    (parser->result).type = SE_INSUFFICIENT_SPACE;
    parser_local = (SExprParser *)0x0;
  }
  return (SExpr *)parser_local;
}

Assistant:

SEXPR_DEF SExpr* SExprAlloc(SExprParser* parser, SExprType type)
{
    static SExpr dummy;

    if(!parser->pool) {
        ++parser->poolUsed;
        return &dummy;
    }

    if(parser->poolUsed >= parser->pool->count) {
        parser->result.type = SE_INSUFFICIENT_SPACE;
        return NULL;
    }

    SExpr* expr = &parser->pool->data[parser->poolUsed++];

    expr->type = type;
    expr->next = NULL;

    return expr;
}